

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source.hpp
# Opt level: O0

void __thiscall
jsoncons::stream_source<char>::stream_source
          (stream_source<char> *this,basic_istream<char,_std::char_traits<char>_> *is,
          size_t buf_size)

{
  vector<char,_std::allocator<char>_> *pvVar1;
  undefined8 uVar2;
  char *pcVar3;
  undefined8 in_RSI;
  vector<char,_std::allocator<char>_> *in_RDI;
  basic_null_istream<char> *in_stack_ffffffffffffffb0;
  allocator_type *__a;
  vector<char,_std::allocator<char>_> *this_00;
  allocator_type local_25 [21];
  undefined8 local_10;
  
  this_00 = in_RDI;
  local_10 = in_RSI;
  basic_null_istream<char>::basic_null_istream(in_stack_ffffffffffffffb0);
  *(undefined8 *)&this_00[0xe].super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x8 =
       local_10;
  pvVar1 = this_00 + 0xe;
  uVar2 = std::ios::rdbuf();
  *(undefined8 *)&(pvVar1->super__Vector_base<char,_std::allocator<char>_>)._M_impl.field_0x10 =
       uVar2;
  *(undefined8 *)&in_RDI[0xf].super__Vector_base<char,_std::allocator<char>_>._M_impl = 0;
  __a = local_25;
  std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector(this_00,(size_type)in_RDI,__a);
  std::allocator<char>::~allocator(local_25);
  pcVar3 = std::vector<char,_std::allocator<char>_>::data
                     ((vector<char,_std::allocator<char>_> *)0x440853);
  *(char **)&in_RDI[0x10].super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x8 = pcVar3
  ;
  *(undefined8 *)&in_RDI[0x10].super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10 =
       0;
  return;
}

Assistant:

stream_source(std::basic_istream<char_type>& is, std::size_t buf_size = default_max_buffer_size)
            : stream_ptr_(std::addressof(is)), sbuf_(is.rdbuf()),
              buffer_(buf_size), buffer_data_(buffer_.data())
        {
        }